

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setRealParam(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,RealParam param,Real value,bool init)

{
  Rational *this_00;
  double dVar1;
  Verbosity VVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  bool bVar4;
  SPxOut *pSVar5;
  undefined7 in_register_00000011;
  Verbosity old_verbosity;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  *this_01;
  element_type *this_02;
  ulong uVar6;
  Real otol;
  negate local_e9;
  Real local_e8;
  Real local_e0;
  Real local_d8;
  Real local_d0;
  Real local_c8;
  longdouble local_bc;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 uStack_43;
  undefined8 local_38;
  
  uVar6 = (ulong)param;
  if ((int)CONCAT71(in_register_00000011,init) == 0) {
    dVar1 = this->_currentSettings->_realParamValues[uVar6];
    if ((dVar1 == value) && (!NAN(dVar1) && !NAN(value))) {
      return true;
    }
  }
  if ((value < (double)(&DAT_006b9600)[uVar6]) ||
     ((double)(&DAT_006b96d8)[uVar6] <= value && value != (double)(&DAT_006b96d8)[uVar6])) {
switchD_0033c102_default:
    bVar4 = false;
  }
  else {
    switch(uVar6) {
    case 0:
      local_e8 = value;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)&this->_rationalFeastol,(longdouble)value);
      Tolerances::setFeastol
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 1:
      if (1e-10 <= value) {
        local_e0 = value;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                     *)&this->_rationalOpttol,(longdouble)value);
        this_02 = (this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        otol = value;
      }
      else {
        VVar2 = (this->spxout).m_verbosity;
        if (0 < (int)VVar2) {
          (this->spxout).m_verbosity = WARNING;
          pSVar5 = soplex::operator<<(&this->spxout,
                                      "Cannot set optimality tolerance to small value ");
          std::ostream::_M_insert<double>(value);
          pSVar5 = soplex::operator<<(pSVar5," without GMP - using ");
          std::ostream::_M_insert<double>(1e-10);
          soplex::operator<<(pSVar5,".\n");
          (this->spxout).m_verbosity = VVar2;
        }
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                     *)&this->_rationalOpttol,(longdouble)1e-10);
        this_02 = (this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        otol = 1e-10;
      }
      Tolerances::setOpttol(this_02,otol);
      break;
    case 2:
      Tolerances::setEpsilon
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 3:
      Tolerances::setEpsilonFactorization
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 4:
      Tolerances::setEpsilonUpdate
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 5:
      Tolerances::setEpsilonPivot
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 6:
      local_bc = (longdouble)value;
      local_d8 = value;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)&this->_rationalPosInfty,local_bc);
      this_00 = &this->_rationalNegInfty;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)this_00,local_bc);
      local_b0.arg = this_00;
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>>
                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                  *)this_00,&local_b0,&local_e9);
      if (this->_currentSettings->_intParamValues[0xf] != 0) {
        _recomputeRangeTypesRational(this);
      }
      break;
    case 7:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x1a:
      break;
    case 8:
    case 9:
      (this->_solver).useTerminationValue = true;
      break;
    case 10:
      Tolerances::setFloatingPointFeastol
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 0xb:
      Tolerances::setFloatingPointOpttol
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
      break;
    case 0xc:
      this_01 = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)&this->_rationalMaxscaleincr;
      local_d0 = value;
LAB_0033c2c9:
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(this_01,(longdouble)value);
      break;
    case 0x16:
      pSVar3 = this->_scaler;
      if (pSVar3 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) {
        local_38 = 0xa00000000;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_4b = 0;
        uStack_48 = 0;
        uStack_43 = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,value);
        (*pSVar3->_vptr_SPxScaler[10])(pSVar3,(cpp_dec_float<50u,int,void> *)&local_68,"realparam");
      }
      break;
    case 0x17:
      if (this->_realLP !=
          (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&this->_realLP->offset,value);
      }
      if (this->_rationalLP != (SPxLPRational *)0x0) {
        this_01 = (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)&this->_rationalLP->offset;
        local_c8 = value;
        goto LAB_0033c2c9;
      }
      break;
    case 0x18:
      local_78 = 0xa00000000;
      local_a8 = 0;
      uStack_a0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      uStack_8b = 0;
      uStack_88 = 0;
      uStack_83 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_a8,value);
      SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setMarkowitz(&this->_slufactor,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_a8);
      break;
    case 0x19:
      dVar1 = this->_currentSettings->_realParamValues[uVar6];
      if ((dVar1 != value) || (NAN(dVar1) || NAN(value))) {
        VVar2 = (this->spxout).m_verbosity;
        if (2 < (int)VVar2) {
          (this->spxout).m_verbosity = INFO1;
          soplex::operator<<(&this->spxout,
                             "Setting Parameter simplifier_modifyrowfac is only possible if SoPlex is build with PaPILO\n"
                            );
          (this->spxout).m_verbosity = VVar2;
        }
        goto switchD_0033c102_default;
      }
      break;
    default:
      goto switchD_0033c102_default;
    }
    this->_currentSettings->_realParamValues[uVar6] = value;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool SoPlexBase<R>::setRealParam(const RealParam param, const Real value, const bool init)
{
   assert(param >= 0);
   assert(param < REALPARAM_COUNT);
   assert(init || _isConsistent());

   if(!init && value == realParam(param))
      return true;

   if(value < _currentSettings->realParam.lower[param]
         || value > _currentSettings->realParam.upper[param])
      return false;

   // required to set a different feastol or opttol
   Real tmp_value = value;

   switch(param)
   {
   // primal feasibility tolerance; passed to the floating point solver only when calling solve()
   case SoPlexBase<R>::FEASTOL:
#ifndef SOPLEX_WITH_BOOST
      if(value < SOPLEX_DEFAULT_EPS_PIVOR)
      {
         SPX_MSG_WARNING(spxout, spxout << "Cannot set feasibility tolerance to small value " << value <<
                         " without GMP - using " << SOPLEX_DEFAULT_EPS_PIVOR << ".\n");
         _rationalFeastol = SOPLEX_DEFAULT_EPS_PIVOR;
         this->_tolerances->setFeastol(SOPLEX_DEFAULT_EPS_PIVOR);
         break;
      }

#endif
      _rationalFeastol = value;
      this->_tolerances->setFeastol(value);
      break;

   // dual feasibility tolerance; passed to the floating point solver only when calling solve()
   case SoPlexBase<R>::OPTTOL:
#ifndef SOPLEX_WITH_GMP
      if(value < SOPLEX_DEFAULT_EPS_PIVOR)
      {
         SPX_MSG_WARNING(spxout, spxout << "Cannot set optimality tolerance to small value " << value <<
                         " without GMP - using " << SOPLEX_DEFAULT_EPS_PIVOR << ".\n");
         _rationalOpttol = SOPLEX_DEFAULT_EPS_PIVOR;
         this->_tolerances->setOpttol(SOPLEX_DEFAULT_EPS_PIVOR);
         break;
      }

#endif
      _rationalOpttol = value;
      this->_tolerances->setOpttol(value);
      break;

   // general zero tolerance
   case SoPlexBase<R>::EPSILON_ZERO:
      _tolerances->setEpsilon(Real(value));
      break;

   // zero tolerance used in factorization
   case SoPlexBase<R>::EPSILON_FACTORIZATION:
      _tolerances->setEpsilonFactorization(Real(value));
      break;

   // zero tolerance used in update of the factorization
   case SoPlexBase<R>::EPSILON_UPDATE:
      _tolerances->setEpsilonUpdate(Real(value));
      break;

   // pivot zero tolerance used in factorization (declare numerical singularity for small LU pivots)
   case SoPlexBase<R>::EPSILON_PIVOT:
      _tolerances->setEpsilonPivot(Real(value));
      break;

   // infinity threshold
   case SoPlexBase<R>::INFTY:
#ifdef SOPLEX_WITH_BOOST
      _rationalPosInfty = value;
      // boost is treating -value as an expression and not just a number<T> So
      // doing -val won't work since Rational doesn't have an operator= that
      // accepts boost expressions. 0-value is a simple fix.

      // @todo Implement expression template?
      // A work around to avoid expression template
      _rationalNegInfty = value;
      _rationalNegInfty = -_rationalNegInfty;
#endif

      if(intParam(SoPlexBase<R>::SYNCMODE) != SYNCMODE_ONLYREAL)
         _recomputeRangeTypesRational();

      break;

   // time limit in seconds (INFTY if unlimited)
   case SoPlexBase<R>::TIMELIMIT:
      break;

   // lower limit on objective value is set in solveReal()
   case SoPlexBase<R>::OBJLIMIT_LOWER:
      this->_solver.toggleTerminationValue(true);
      break;

   // upper limit on objective value is set in solveReal()
   case SoPlexBase<R>::OBJLIMIT_UPPER:
      this->_solver.toggleTerminationValue(true);
      break;

   // working tolerance for feasibility in floating-point solver
   case SoPlexBase<R>::FPFEASTOL:
      this->_tolerances->setFloatingPointFeastol(value);
      break;

   // working tolerance for optimality in floating-point solver
   case SoPlexBase<R>::FPOPTTOL:
      this->_tolerances->setFloatingPointOpttol(value);
      break;

   // maximum increase of scaling factors between refinements
   case SoPlexBase<R>::MAXSCALEINCR:
      _rationalMaxscaleincr = value;
      break;

   // lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)
   case SoPlexBase<R>::LIFTMINVAL:
      break;

   // upper threshold in lifting (nonzero matrix coefficients with larger absolute value will be reformulated)
   case SoPlexBase<R>::LIFTMAXVAL:
      break;

   // threshold for sparse pricing
   case SoPlexBase<R>::SPARSITY_THRESHOLD:
      break;

   // threshold on number of rows vs. number of columns for switching from column to row representations in auto mode
   case SoPlexBase<R>::REPRESENTATION_SWITCH:
      break;

   // geometric frequency at which to apply rational reconstruction
   case SoPlexBase<R>::RATREC_FREQ:
      break;

   // minimal reduction (sum of removed rows/cols) to continue simplification
   case SoPlexBase<R>::MINRED:
      break;

   case SoPlexBase<R>::REFAC_BASIS_NNZ:
      break;

   case SoPlexBase<R>::REFAC_UPDATE_FILL:
      break;

   case SoPlexBase<R>::REFAC_MEM_FACTOR:
      break;

   // accuracy of conjugate gradient method in least squares scaling (higher value leads to more iterations)
   case SoPlexBase<R>::LEASTSQ_ACRCY:
      if(_scaler)
         _scaler->setRealParam(value);

      break;

   // objective offset
   case SoPlexBase<R>::OBJ_OFFSET:
      if(_realLP)
         _realLP->changeObjOffset(value);

      if(_rationalLP)
         _rationalLP->changeObjOffset(value);

      break;

   case SoPlexBase<R>::MIN_MARKOWITZ:
      _slufactor.setMarkowitz(value);
      break;

   case SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC:
#ifdef SOPLEX_WITH_PAPILO
      _simplifierPaPILO.setModifyConsFrac(value);
#else

      if(_currentSettings->_realParamValues[param] != value)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Setting Parameter simplifier_modifyrowfac is only possible if SoPlex is build with PaPILO\n");
         return false;
      }

#endif
      break;

   // factor by which the precision of the floating-point solver is multiplied
   case SoPlexBase<R>::PRECISION_BOOSTING_FACTOR:
      break;

   default:
      return false;
   }

   _currentSettings->_realParamValues[param] = tmp_value;
   return true;
}